

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverse.cpp
# Opt level: O0

DefaultInitVec<uint8_t> * readInto(DefaultInitVec<uint8_t> *__return_storage_ptr__,path *path)

{
  _Ios_Openmode __oflag;
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  int *piVar3;
  char *pcVar4;
  size_type sVar5;
  streambuf *psVar6;
  uchar *puVar7;
  long lVar8;
  size_type sVar9;
  size_type local_1c0;
  size_t newSize;
  size_t nbRead;
  size_t oldSize;
  size_t curSize;
  string local_140;
  undefined1 local_110 [8];
  File file;
  path *path_local;
  DefaultInitVec<uint8_t> *data;
  
  file._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._240_8_ =
       path;
  File::File((File *)local_110);
  __oflag = std::operator|(_S_in,_S_bin);
  iVar1 = File::open((File *)local_110,(char *)path,__oflag);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    File::string(&local_140,(File *)local_110,path);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_140);
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fatal("Failed to open \"%s\": %s",pcVar2,pcVar4);
  }
  curSize._7_1_ = 0;
  default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>::default_init_allocator
            ((default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_> *)
             ((long)&curSize + 6));
  std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::vector(__return_storage_ptr__,0x800,
           (default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_> *)
           ((long)&curSize + 6));
  default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>::~default_init_allocator
            ((default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_> *)
             ((long)&curSize + 6));
  oldSize = 0;
  while( true ) {
    sVar5 = std::
            vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::size(__return_storage_ptr__);
    psVar6 = File::operator->((File *)local_110);
    puVar7 = std::
             vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::data(__return_storage_ptr__);
    lVar8 = std::streambuf::sgetn((char *)psVar6,(long)(puVar7 + oldSize));
    if (lVar8 != sVar5 - oldSize) {
      std::
      vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::resize(__return_storage_ptr__,oldSize + lVar8);
      curSize._7_1_ = 1;
      File::~File((File *)local_110);
      return __return_storage_ptr__;
    }
    sVar9 = std::
            vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::capacity(__return_storage_ptr__);
    if (oldSize == sVar9) {
      local_1c0 = oldSize << 1;
    }
    else {
      local_1c0 = std::
                  vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::capacity(__return_storage_ptr__);
    }
    if (oldSize == local_1c0) break;
    std::
    vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>::
    resize(__return_storage_ptr__,local_1c0);
    oldSize = sVar5;
  }
  __assert_fail("oldSize != newSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/reverse.cpp"
                ,0x31,"readInto");
}

Assistant:

static DefaultInitVec<uint8_t> readInto(std::filesystem::path path) {
	File file;
	if (!file.open(path, std::ios::in | std::ios::binary)) {
		fatal("Failed to open \"%s\": %s", file.string(path).c_str(), strerror(errno));
	}
	DefaultInitVec<uint8_t> data(128 * 16); // Begin with some room pre-allocated

	size_t curSize = 0;
	for (;;) {
		size_t oldSize = curSize;
		curSize = data.size();

		// Fill the new area ([oldSize; curSize[) with bytes
		size_t nbRead =
		    file->sgetn(reinterpret_cast<char *>(&data.data()[oldSize]), curSize - oldSize);
		if (nbRead != curSize - oldSize) {
			// Shrink the vector to discard bytes that weren't read
			data.resize(oldSize + nbRead);
			break;
		}
		// If the vector has some capacity left, use it; otherwise, double the current size

		// Arbitrary, but if you got a better idea...
		size_t newSize = oldSize != data.capacity() ? data.capacity() : oldSize * 2;
		assert(oldSize != newSize);
		data.resize(newSize);
	}

	return data;
}